

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

_Bool Curl_cpool_find(Curl_easy *data,char *destination,Curl_cpool_conn_match_cb *conn_cb,
                     Curl_cpool_done_match_cb *done_cb,void *userdata)

{
  _Bool _Var1;
  cpool *h;
  size_t sVar2;
  Curl_llist *list;
  connectdata *pcVar3;
  connectdata *conn;
  Curl_llist_node *curr;
  _Bool result;
  cpool_bundle *bundle;
  cpool *cpool;
  void *userdata_local;
  Curl_cpool_done_match_cb *done_cb_local;
  Curl_cpool_conn_match_cb *conn_cb_local;
  char *destination_local;
  Curl_easy *data_local;
  
  h = cpool_get_instance(data);
  curr._7_1_ = false;
  if (h == (cpool *)0x0) {
    data_local._7_1_ = false;
  }
  else {
    if (h != (cpool *)0x0) {
      if ((h->share != (Curl_share *)0x0) && ((h->share->specifier & 0x20) != 0)) {
        Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      h->field_0x68 = h->field_0x68 & 0xfe | 1;
    }
    sVar2 = strlen(destination);
    list = (Curl_llist *)Curl_hash_pick(&h->dest2bundle,destination,sVar2 + 1);
    if (list != (Curl_llist *)0x0) {
      conn = (connectdata *)Curl_llist_head(list);
      do {
        if (conn == (connectdata *)0x0) goto LAB_00122c97;
        pcVar3 = (connectdata *)Curl_node_elem(&conn->cpool_node);
        conn = (connectdata *)Curl_node_next(&conn->cpool_node);
        _Var1 = (*conn_cb)(pcVar3,userdata);
      } while (!_Var1);
      curr._7_1_ = true;
    }
LAB_00122c97:
    if (done_cb != (Curl_cpool_done_match_cb *)0x0) {
      curr._7_1_ = (*done_cb)(curr._7_1_,userdata);
    }
    if (((h != (cpool *)0x0) &&
        (h->field_0x68 = h->field_0x68 & 0xfe, h->share != (Curl_share *)0x0)) &&
       ((h->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
    data_local._7_1_ = curr._7_1_;
  }
  return data_local._7_1_;
}

Assistant:

bool Curl_cpool_find(struct Curl_easy *data,
                     const char *destination,
                     Curl_cpool_conn_match_cb *conn_cb,
                     Curl_cpool_done_match_cb *done_cb,
                     void *userdata)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  bool result = FALSE;

  DEBUGASSERT(cpool);
  DEBUGASSERT(conn_cb);
  if(!cpool)
    return FALSE;

  CPOOL_LOCK(cpool, data);
  bundle = Curl_hash_pick(&cpool->dest2bundle,
                          CURL_UNCONST(destination),
                          strlen(destination) + 1);
  if(bundle) {
    struct Curl_llist_node *curr = Curl_llist_head(&bundle->conns);
    while(curr) {
      struct connectdata *conn = Curl_node_elem(curr);
      /* Get next node now. callback might discard current */
      curr = Curl_node_next(curr);

      if(conn_cb(conn, userdata)) {
        result = TRUE;
        break;
      }
    }
  }

  if(done_cb) {
    result = done_cb(result, userdata);
  }
  CPOOL_UNLOCK(cpool, data);
  return result;
}